

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prmonutils.cpp
# Opt level: O3

bool prmon::kernel_proc_pid_test(pid_t pid)

{
  int iVar1;
  ostream *poVar2;
  stringstream pid_fname;
  stat stat_test;
  char *local_248;
  char local_238 [16];
  stringstream local_228 [16];
  ostream local_218 [112];
  ios_base local_1a8 [264];
  stat local_a0;
  
  std::__cxx11::stringstream::stringstream(local_228);
  std::__ostream_insert<char,std::char_traits<char>>(local_218,"/proc/",6);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_218,pid);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/task/",6);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,pid);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/children",9);
  std::ostream::put((char)poVar2);
  std::__cxx11::stringbuf::str();
  iVar1 = stat(local_248,&local_a0);
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  std::__cxx11::stringstream::~stringstream(local_228);
  std::ios_base::~ios_base(local_1a8);
  return iVar1 == 0;
}

Assistant:

bool kernel_proc_pid_test(const pid_t pid) {
  // Return true if the kernel has child PIDs
  // accessible via /proc
  std::stringstream pid_fname{};
  pid_fname << "/proc/" << pid << "/task/" << pid << "/children" << std::ends;
  struct stat stat_test;
  if (stat(pid_fname.str().c_str(), &stat_test)) return false;
  return true;
}